

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O1

void google::protobuf::internal::DeleteEmptyString(void)

{
  if (DAT_003e3f50 == '\x01') {
    DAT_003e3f50 = '\0';
    if (fixed_address_empty_string_abi_cxx11_ != &DAT_003e3f40) {
      operator_delete(fixed_address_empty_string_abi_cxx11_,DAT_003e3f40 + 1);
      return;
    }
  }
  return;
}

Assistant:

void Shutdown() {
    if (init_) {
      init_ = false;
      get_mutable()->~T();
    }
  }